

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void update_player_regions(level *lev)

{
  int iVar1;
  region *reg;
  boolean bVar2;
  int x;
  long lVar3;
  int y;
  
  iVar1 = lev->n_regions;
  x = (int)u.ux;
  y = (int)u.uy;
  lVar3 = 0;
  do {
    if (iVar1 <= lVar3) {
      return;
    }
    reg = lev->regions[lVar3];
    if (reg->attach_2_u == '\0') {
      bVar2 = inside_region(reg,x,y);
      if (bVar2 == '\0') goto LAB_002234e2;
      reg->player_flags = reg->player_flags | 1;
    }
    else {
LAB_002234e2:
      reg->player_flags = reg->player_flags & 0xfe;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void update_player_regions(struct level *lev)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	if (!lev->regions[i]->attach_2_u && inside_region(lev->regions[i], u.ux, u.uy))
	    set_hero_inside(lev->regions[i]);
	else
	    clear_hero_inside(lev->regions[i]);
}